

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<testing::ActionInterface<test_result_(fmt::v5::monostate)>_> * __thiscall
testing::internal::linked_ptr<testing::ActionInterface<test_result_(fmt::v5::monostate)>_>::
operator=(linked_ptr<testing::ActionInterface<test_result_(fmt::v5::monostate)>_> *this,
         linked_ptr<testing::ActionInterface<test_result_(fmt::v5::monostate)>_> *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::ActionInterface<test_result(fmt::v5::monostate)>>::
    copy<testing::ActionInterface<test_result(fmt::v5::monostate)>>
              ((linked_ptr<testing::ActionInterface<test_result(fmt::v5::monostate)>> *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }